

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::~SmallVector
          (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *this)

{
  Entry *S;
  
  S = (Entry *)(this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
               super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
               super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
               super_SmallVectorBase.BeginX;
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::destroy_range
            (S,S + (this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
                   super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                   super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                   super_SmallVectorBase.Size);
  SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::~SmallVectorImpl
            (&this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>);
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }